

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O3

UnblindRawTransactionResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::UnblindRawTransactionRequestStruct,cfd::js::api::UnblindRawTransactionResponseStruct>
          (UnblindRawTransactionResponseStruct *__return_storage_ptr__,api *this,
          UnblindRawTransactionRequestStruct *request,
          function<cfd::js::api::UnblindRawTransactionResponseStruct_(const_cfd::js::api::UnblindRawTransactionRequestStruct_&)>
          *call_function,string *fuction_name)

{
  _Rb_tree_header *p_Var1;
  CfdException *cfde;
  long *plVar2;
  undefined1 auVar3 [12];
  undefined1 local_178 [16];
  _Alloc_hider local_168;
  _Base_ptr local_148;
  _Base_ptr local_140;
  string *local_138;
  anon_enum_32 local_12c;
  undefined1 local_128 [40];
  _Alloc_hider _Stack_100;
  pointer local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  pointer local_e0;
  _Rb_tree_color local_d8;
  _Base_ptr local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined1 local_a0 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->outputs).
  super__Vector_base<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->outputs).
  super__Vector_base<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->outputs).
  super__Vector_base<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->issuance_outputs).
  super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->issuance_outputs).
  super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->issuance_outputs).
  super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       local_140;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cfd::Initialize();
  if ((request->tx).field_2._M_allocated_capacity == 0) {
    auVar3 = std::__throw_bad_function_call();
    if (auVar3._8_4_ == 3) {
      cfde = (CfdException *)__cxa_begin_catch(auVar3._0_8_);
      local_128._0_8_ = "cfdjs_internal.h";
      local_128._8_4_ = 0x32;
      local_128._16_8_ = "ExecuteStructApi";
      local_12c = (**(code **)(*(long *)cfde + 0x18))(cfde);
      local_178._0_8_ = (**(code **)(*(long *)cfde + 0x10))(cfde);
      core::logger::log<std::__cxx11::string&,cfd::core::CfdError&,char_const*&>
                ((CfdSourceLocation *)local_128,kCfdLogLevelWarning,
                 "Failed to {}. CfdException occurred:  code={}, message={}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)call_function,
                 &local_12c,(char **)local_178);
      ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_128,cfde);
      InnerErrorResponseStruct::operator=
                (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_128);
      InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_128);
      __cxa_end_catch();
    }
    else {
      plVar2 = (long *)__cxa_begin_catch(auVar3._0_8_);
      if (auVar3._8_4_ == 2) {
        local_128._0_8_ = "cfdjs_internal.h";
        local_128._8_4_ = 0x38;
        local_128._16_8_ = "ExecuteStructApi";
        local_178._0_8_ = (**(code **)(*plVar2 + 0x10))(plVar2);
        core::logger::log<std::__cxx11::string&,char_const*&>
                  ((CfdSourceLocation *)local_128,kCfdLogLevelWarning,
                   "Failed to {}. Exception occurred: message={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function,(char **)local_178);
        core::CfdException::CfdException((CfdException *)local_178);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_128,(CfdException *)local_178)
        ;
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_128);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_128);
        core::CfdException::~CfdException((CfdException *)local_178);
        __cxa_end_catch();
      }
      else {
        local_128._0_8_ = "cfdjs_internal.h";
        local_128._8_4_ = 0x3d;
        local_128._16_8_ = "ExecuteStructApi";
        core::logger::log<std::__cxx11::string&>
                  ((CfdSourceLocation *)local_128,kCfdLogLevelWarning,
                   "Failed to {}. Unknown exception occurred.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function);
        core::CfdException::CfdException((CfdException *)local_178);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_128,(CfdException *)local_178)
        ;
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_128);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_128);
        core::CfdException::~CfdException((CfdException *)local_178);
        __cxa_end_catch();
      }
    }
  }
  else {
    local_148 = &p_Var1->_M_header;
    (**(code **)((long)&(request->tx).field_2 + 8))((string *)local_128,request,this);
    local_138 = (string *)&(__return_storage_ptr__->error).message;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_128);
    local_168._M_p =
         (pointer)(__return_storage_ptr__->outputs).
                  super__Vector_base<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->outputs).
    super__Vector_base<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
    local_178._0_8_ =
         (__return_storage_ptr__->outputs).
         super__Vector_base<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_178._8_8_ =
         (__return_storage_ptr__->outputs).
         super__Vector_base<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->outputs).
    super__Vector_base<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_128._32_8_;
    (__return_storage_ptr__->outputs).
    super__Vector_base<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_100._M_p;
    local_128._32_8_ = 0;
    _Stack_100._M_p = (pointer)0x0;
    local_f8 = (pointer)0x0;
    std::
    vector<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>::
    ~vector((vector<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
             *)local_178);
    local_168._M_p =
         (pointer)(__return_storage_ptr__->issuance_outputs).
                  super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->issuance_outputs).
    super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_e0;
    local_178._0_8_ =
         (__return_storage_ptr__->issuance_outputs).
         super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_178._8_8_ =
         (__return_storage_ptr__->issuance_outputs).
         super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->issuance_outputs).
    super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f0._M_allocated_capacity;
    (__return_storage_ptr__->issuance_outputs).
    super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f0._8_8_;
    local_f0._M_allocated_capacity = 0;
    local_f0._8_8_ = 0;
    local_e0 = (pointer)0x0;
    std::
    vector<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
    ::~vector((vector<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
               *)local_178);
    (__return_storage_ptr__->error).code = local_d8;
    std::__cxx11::string::operator=
              ((string *)&(__return_storage_ptr__->error).type,(string *)local_d0);
    std::__cxx11::string::operator=(local_138,(string *)&local_b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
    if (_Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &_Stack_90._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_color;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = local_148;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count
           = _Stack_90._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
    if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &_Stack_60._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = local_140;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_60._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&_Stack_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&_Stack_90);
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0[0] != (_Base_ptr)local_c0) {
      operator_delete(local_d0[0]);
    }
    std::
    vector<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
    ::~vector((vector<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
               *)&local_f0);
    std::
    vector<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>::
    ~vector((vector<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>
             *)(local_128 + 0x20));
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}